

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  FILE *pFVar2;
  vw *this;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  typed_value<int,_char> *ptVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  size_type sVar8;
  ostream *poVar9;
  FILE *__stream;
  int *piVar10;
  FILE *__stream_00;
  FILE *__stream_01;
  __ssize_t _Var11;
  size_t sVar12;
  char *line;
  example *ec;
  polyprediction *__x;
  allocator local_22a;
  allocator local_229;
  undefined1 local_228 [40];
  vw *local_200;
  size_t len;
  char *u;
  char *i;
  char *buf;
  string str;
  string local_1b8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_198;
  options_description desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [144];
  
  boost::program_options::variables_map::variables_map(&vm);
  std::__cxx11::string::string((string *)local_228,"Allowed options",(allocator *)&str);
  boost::program_options::options_description::options_description
            (&desc,(string *)local_228,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_228);
  local_228._0_8_ = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_228,"help,h");
  ptVar6 = boost::program_options::value<int>(&topk);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"topk",(char *)ptVar6);
  ptVar6 = boost::program_options::value<int>(&verbose);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"verbose,v",(char *)ptVar6);
  ptVar6 = boost::program_options::value<int>(&b);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"bf_bits,b",(char *)ptVar6);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&blacklistfilename_abi_cxx11_);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"blacklist,B",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&userfilename_abi_cxx11_);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"users,U",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&itemfilename_abi_cxx11_);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"items,I",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&vwparams_abi_cxx11_);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"vwparams",(char *)ptVar7);
  local_198.super_function_base.vtable = (vtable_base *)0x0;
  local_198.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_198.super_function_base.functor._8_8_ = 0;
  local_198.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_228,argc,argv,&desc,0,&local_198);
  boost::program_options::store((basic_parsed_options *)local_228,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_228);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_198);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)local_228,"help",(allocator *)&str);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  if (sVar8 != 0) {
    poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    std::operator<<(poVar9,"\n");
    boost::program_options::options_description::~options_description(&desc);
    boost::program_options::variables_map::~variables_map(&vm);
    return 1;
  }
  if ((((blacklistfilename_abi_cxx11_._M_string_length == 0) ||
       (userfilename_abi_cxx11_._M_string_length == 0)) ||
      (itemfilename_abi_cxx11_._M_string_length == 0)) ||
     (vwparams_abi_cxx11_._M_string_length == 0)) {
    poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
    std::operator<<(poVar9,"\n");
  }
  else {
    __stream = fopen64(blacklistfilename_abi_cxx11_._M_dataplus._M_p,"r");
    pFVar2 = _stderr;
    _Var1 = blacklistfilename_abi_cxx11_._M_dataplus;
    if (__stream == (FILE *)0x0) {
      piVar10 = __errno_location();
      pcVar5 = strerror(*piVar10);
      fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar5);
      poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,&desc);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      __stream_00 = fopen64(userfilename_abi_cxx11_._M_dataplus._M_p,"r");
      pFVar2 = _stderr;
      _Var1 = userfilename_abi_cxx11_._M_dataplus;
      if (__stream_00 == (FILE *)0x0) {
        piVar10 = __errno_location();
        pcVar5 = strerror(*piVar10);
        fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar5);
        poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,&desc);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      else {
        __stream_01 = fopen64(itemfilename_abi_cxx11_._M_dataplus._M_p,"r");
        pFVar2 = _stderr;
        _Var1 = itemfilename_abi_cxx11_._M_dataplus;
        if (__stream_01 != (FILE *)0x0) {
          buf = (char *)0x0;
          u = (char *)0x0;
          i = (char *)0x0;
          len = 0;
          if (0 < verbose) {
            fwrite("loading blacklist into bloom filter...\n",0x27,1,_stderr);
          }
          pcVar5 = bf_new(b);
          while (_Var11 = getline(&buf,&len,__stream), _Var11 != -1) {
            bf_add(pcVar5,buf);
            banned = banned + 1;
          }
          if (verbose != 0) {
            bf_info(pcVar5,(FILE *)_stderr);
            fprintf(_stderr,"%d banned pairs\n",(ulong)(uint)banned);
            if (0 < verbose) {
              fwrite("initializing vw...\n",0x13,1,_stderr);
            }
          }
          std::__cxx11::string::string((string *)&local_1b8,(string *)&vwparams_abi_cxx11_);
          local_200 = VW::initialize(&local_1b8,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0
                                    );
          std::__cxx11::string::~string((string *)&local_1b8);
          if (0 < verbose) {
            fwrite("predicting...\n",0xe,1,_stderr);
            fprintf(_stderr,"%12s %8s %8s %8s %12s %s %s\n","pair","user","item","rec","skipped",
                    "userfile","itemfile");
          }
          line = (char *)0x0;
          do {
            _Var11 = getline(&u,&len,__stream_00);
            pcVar3 = u;
            if (_Var11 == -1) {
              if (0 < verbose) {
                progress();
              }
              VW::finish(local_200,true);
              fclose(__stream_01);
              fclose(__stream_00);
              exit(0);
            }
            users = users + 1;
            sVar12 = strlen(u);
            pcVar3[sVar12 - 1] = '\0';
            rewind(__stream_01);
            items = 0;
            while( true ) {
              _Var11 = getline(&i,&len,__stream_01);
              if (_Var11 == -1) break;
              items = items + 1;
              pairs = pairs + 1;
              if ((0 < verbose) && (pairs % show == 0)) {
                progress();
                show = show << 1;
              }
              free(line);
              std::__cxx11::string::string((string *)&str,u,&local_229);
              std::__cxx11::string::string((string *)&local_f0,i,&local_22a);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228,&str,&local_f0);
              line = strdup((char *)local_228._0_8_);
              std::__cxx11::string::~string((string *)local_228);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&str);
              iVar4 = bf_hit(pcVar5,line);
              this = local_200;
              if (iVar4 == 0) {
                ec = VW::read_example(local_200,line);
                vw::learn(this,ec);
                std::__cxx11::string::string((string *)&str,line,(allocator *)local_228);
                __x = &ec->pred;
                if ((ulong)(((long)pr_queue_abi_cxx11_.c.
                                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pr_queue_abi_cxx11_.c.
                                  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28) <
                    (ulong)(long)topk) {
                  std::
                  pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<float_&,_true>
                            ((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_228,&__x->scalar,&str);
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::push(&pr_queue_abi_cxx11_,(value_type *)local_228);
LAB_00117278:
                  std::__cxx11::string::~string((string *)(local_228 + 8));
                }
                else if ((pr_queue_abi_cxx11_.c.
                          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first <= __x->scalar &&
                         __x->scalar !=
                         (pr_queue_abi_cxx11_.c.
                          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first) {
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::pop(&pr_queue_abi_cxx11_);
                  std::
                  pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<float_&,_true>
                            ((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_228,&__x->scalar,&str);
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::push(&pr_queue_abi_cxx11_,(value_type *)local_228);
                  goto LAB_00117278;
                }
                VW::finish_example(local_200,ec);
                std::__cxx11::string::~string((string *)&str);
              }
              else {
                skipped = skipped + 1;
                if (1 < verbose) {
                  fprintf(_stderr,"skipping:#%s#\n",line);
                }
              }
            }
            while (pr_queue_abi_cxx11_.c.
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   pr_queue_abi_cxx11_.c.
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (&std::cout,
                                  (pr_queue_abi_cxx11_.c.
                                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first);
              poVar9 = std::operator<<(poVar9,"\t");
              std::operator<<(poVar9,(string *)
                                     &(pr_queue_abi_cxx11_.c.
                                       super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->second);
              std::
              priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
              ::pop(&pr_queue_abi_cxx11_);
              recs = recs + 1;
            }
          } while( true );
        }
        piVar10 = __errno_location();
        pcVar5 = strerror(*piVar10);
        fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar5);
        poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,&desc);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
  }
  exit(2);
}

Assistant:

int main(int argc, char *argv[])
{ po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("topk", po::value<int>(&topk), "number of items to recommend per user")
  ("verbose,v", po::value<int>(&verbose), "increase verbosity (can be repeated)")
  ("bf_bits,b", po::value<int>(&b), "number of items to recommend")
  ("blacklist,B", po::value<string>(&blacklistfilename), "user item pairs (in vw format) that we should not recommend (have been seen before)")
  ("users,U", po::value<string>(&userfilename), "users portion in vw format to make recs for")
  ("items,I", po::value<string>(&itemfilename), "items (in vw format) to recommend from")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model ...)")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help"))
  { cout << desc << "\n";
    return 1;
  }

  if (blacklistfilename.empty() || userfilename.empty() || itemfilename.empty() || vwparams.empty())
  { cout << desc << "\n";
    exit(2);
  }

  FILE * fB;
  FILE * fU;
  FILE * fI;

  if((fB = fopen(blacklistfilename.c_str(), "r")) == NULL)
  { fprintf(stderr,"can't open %s: %s\n", blacklistfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fU = fopen(userfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", userfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fI = fopen(itemfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", itemfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }

  char * buf = NULL;
  char * u = NULL;
  char * i = NULL;
  size_t len = 0;
  ssize_t read;

  /* make the bloom filter */
  if(verbose>0)
    fprintf(stderr, "loading blacklist into bloom filter...\n");
  char *bf= bf_new(b);

  /* loop over the source file */
  while ((read = getline(&buf,&len,fB)) != -1)
  { bf_add(bf,buf);
    banned++;
  }

  /* print saturation etc */
  if (verbose)
  { bf_info(bf,stderr);
    fprintf(stderr, "%d banned pairs\n", banned);
  }

  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE
  if(verbose>0)
    fprintf(stderr, "initializing vw...\n");
  vw* model = VW::initialize(vwparams);

  char * estr = NULL;

  if(verbose>0)
  { fprintf(stderr, "predicting...\n");
    fprintf(stderr, "%12s %8s %8s %8s %12s %s %s\n", "pair", "user", "item", "rec", "skipped", "userfile", "itemfile");
  }
  while ((read = getline(&u, &len, fU)) != -1)
  { users++;
    u[strlen(u)-1] = 0; // chop
    rewind(fI);
    items=0;
    while ((read = getline(&i, &len, fI)) != -1)
    { items++;
      pairs++;

      if((verbose > 0) & (pairs % show == 0))
      { progress();
        show *= 2;
      }

      free(estr);
      estr = strdup((string(u)+string(i)).c_str());

      if (!bf_hit(bf,estr))
      { example *ex = VW::read_example(*model, estr);
        model->learn(*ex);

        const string str(estr);

        if(pr_queue.size() < (size_t)topk)
        { pr_queue.push(make_pair(ex->pred.scalar, str));
        }
        else if(pr_queue.top().first < ex->pred.scalar)
        { pr_queue.pop();
          pr_queue.push(make_pair(ex->pred.scalar, str));
        }

        VW::finish_example(*model, *ex);
      }
      else
      { skipped++;
        if(verbose>=2)
          fprintf(stderr,"skipping:#%s#\n", estr);
      }

    }

    while(!pr_queue.empty())
    { cout << pr_queue.top().first << "\t" << pr_queue.top().second;
      pr_queue.pop();
      recs++;
    }
  }
  if(verbose>0)
  { progress();
  }

  VW::finish(*model);
  fclose(fI);
  fclose(fU);
  exit(EXIT_SUCCESS);

}